

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serve_static_content.hpp
# Opt level: O2

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
serve_static_content<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,string *path,romfs *file_system)

{
  anon_class_32_4_bb30a193 f;
  descriptor<pstore::details::posix_descriptor_traits> dVar1;
  http *local_70;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> local_68
  ;
  string *local_60;
  descriptor<pstore::details::posix_descriptor_traits> *pdStack_58;
  http **local_50;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
  *prStack_48;
  descriptor<pstore::details::posix_descriptor_traits> local_40;
  error_or<pstore::romfs::stat> local_38;
  
  dVar1 = io._M_data[1];
  local_70 = this;
  local_68._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)sender;
  if (dVar1 == (descriptor<pstore::details::posix_descriptor_traits>)0x0) {
    std::__cxx11::string::assign((char *)io._M_data);
    dVar1 = io._M_data[1];
  }
  local_40 = *io._M_data;
  if (*(char *)((long)local_40 + -1 + (long)dVar1) == '/') {
    std::__cxx11::string::append((char *)io._M_data);
    local_40 = *io._M_data;
  }
  local_50 = &local_70;
  prStack_48 = &local_68;
  local_60 = path;
  pdStack_58 = io._M_data;
  pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_40);
  romfs::romfs::stat((romfs *)&local_38,(char *)path,(stat *)local_40);
  f.path = (string *)pdStack_58;
  f.file_system = (romfs *)local_60;
  f.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              **)local_50;
  f.io = prStack_48;
  pstore::operator>>=(__return_storage_ptr__,&local_38,f);
  error_or<pstore::romfs::stat>::~error_or(&local_38);
  return __return_storage_ptr__;
}

Assistant:

pstore::error_or<IO> serve_static_content (Sender sender, IO io, std::string path,
                                                   pstore::romfs::romfs const & file_system) {
            if (path.empty ()) {
                path = "/";
            }
            if (path.back () == '/') {
                path += "index.html";
            }

            return file_system.stat (path.c_str ()) >>= [&] (pstore::romfs::stat const & stat) {
                return file_system.open (path.c_str ()) >>= [&] (pstore::romfs::descriptor fd) {
                    // Send the response header.
                    std::ostringstream os;
                    os << "HTTP/1.0 200 OK" << crlf               //
                       << "Server: " << server_name << crlf       //
                       << "Content-length: " << stat.size << crlf //
                       << "Content-type: " << pstore::http::media_type_from_filename (path)
                       << crlf //
                       << "Connection: close"
                       << crlf // TODO remove this when we support persistent connections
                       << "Date: " << http_date (std::chrono::system_clock::now ()) << crlf //
                       << "Last-Modified: " << http_date (stat.mtime) << crlf               //
                       << crlf;
                    return send (sender, io, os.str ()) >>=
                           [&] (IO io2) { return details::read_and_send (sender, io2, fd); };
                };
            };
        }